

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void HalfMergeUVRow_C(uint8_t *src_u,int src_stride_u,uint8_t *src_v,int src_stride_v,
                     uint8_t *dst_uv,int width)

{
  int x;
  int width_local;
  uint8_t *dst_uv_local;
  int src_stride_v_local;
  uint8_t *src_v_local;
  int src_stride_u_local;
  uint8_t *src_u_local;
  
  dst_uv_local = dst_uv;
  src_v_local = src_v;
  src_u_local = src_u;
  for (x = 0; x < width + -1; x = x + 2) {
    *dst_uv_local =
         (uint8_t)((int)((uint)*src_u_local + (uint)src_u_local[1] + (uint)src_u_local[src_stride_u]
                         + (uint)src_u_local[src_stride_u + 1] + 2) >> 2);
    dst_uv_local[1] =
         (uint8_t)((int)((uint)*src_v_local + (uint)src_v_local[1] + (uint)src_v_local[src_stride_v]
                         + (uint)src_v_local[src_stride_v + 1] + 2) >> 2);
    src_u_local = src_u_local + 2;
    src_v_local = src_v_local + 2;
    dst_uv_local = dst_uv_local + 2;
  }
  if ((width & 1U) != 0) {
    *dst_uv_local = (uint8_t)((int)((uint)*src_u_local + (uint)src_u_local[src_stride_u] + 1) >> 1);
    dst_uv_local[1] =
         (uint8_t)((int)((uint)*src_v_local + (uint)src_v_local[src_stride_v] + 1) >> 1);
  }
  return;
}

Assistant:

void HalfMergeUVRow_C(const uint8_t* src_u,
                      int src_stride_u,
                      const uint8_t* src_v,
                      int src_stride_v,
                      uint8_t* dst_uv,
                      int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_uv[0] = (src_u[0] + src_u[1] + src_u[src_stride_u] +
                 src_u[src_stride_u + 1] + 2) >>
                2;
    dst_uv[1] = (src_v[0] + src_v[1] + src_v[src_stride_v] +
                 src_v[src_stride_v + 1] + 2) >>
                2;
    src_u += 2;
    src_v += 2;
    dst_uv += 2;
  }
  if (width & 1) {
    dst_uv[0] = (src_u[0] + src_u[src_stride_u] + 1) >> 1;
    dst_uv[1] = (src_v[0] + src_v[src_stride_v] + 1) >> 1;
  }
}